

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O2

void __thiscall
leveldb::AddBoundaryInputsTest_TestNoBoundaryFiles_Test::
AddBoundaryInputsTest_TestNoBoundaryFiles_Test(AddBoundaryInputsTest_TestNoBoundaryFiles_Test *this)

{
  AddBoundaryInputsTest::AddBoundaryInputsTest(&this->super_AddBoundaryInputsTest);
  (this->super_AddBoundaryInputsTest).super_Test._vptr_Test =
       (_func_int **)&PTR__AddBoundaryInputsTest_0015c630;
  return;
}

Assistant:

TEST_F(AddBoundaryInputsTest, TestNoBoundaryFiles) {
  FileMetaData* f1 =
      CreateFileMetaData(1, InternalKey("100", 2, kTypeValue),
                         InternalKey(InternalKey("100", 1, kTypeValue)));
  FileMetaData* f2 =
      CreateFileMetaData(1, InternalKey("200", 2, kTypeValue),
                         InternalKey(InternalKey("200", 1, kTypeValue)));
  FileMetaData* f3 =
      CreateFileMetaData(1, InternalKey("300", 2, kTypeValue),
                         InternalKey(InternalKey("300", 1, kTypeValue)));

  level_files_.push_back(f3);
  level_files_.push_back(f2);
  level_files_.push_back(f1);
  compaction_files_.push_back(f2);
  compaction_files_.push_back(f3);

  AddBoundaryInputs(icmp_, level_files_, &compaction_files_);
  ASSERT_EQ(2, compaction_files_.size());
}